

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawSplineSegmentBezierCubic
               (Vector2 p1,Vector2 c2,Vector2 c3,Vector2 p4,float thick,Color color)

{
  int iVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  float local_228;
  float local_218;
  float fStack_214;
  float local_208;
  float fStack_204;
  float local_1f8;
  float fStack_1f4;
  float afStack_1c4 [3];
  Vector2 local_1b8;
  float local_1b0;
  float local_1ac;
  float afStack_1a8 [98];
  
  memset(&local_1b8,0,400);
  fStack_214 = c2.y;
  afStack_1c4[0] = fStack_214;
  afStack_1c4[1] = fStack_214;
  afStack_1c4[2] = fStack_214;
  fStack_204 = c3.y;
  fStack_1f4 = p4.y;
  local_244 = local_1b8.x;
  local_250 = local_1b8.y;
  local_24c = local_1b0;
  lVar2 = 0x1c;
  iVar1 = 1;
  local_248 = local_1ac;
  local_228 = p1.x;
  fVar3 = p1.y;
  fVar8 = local_228;
  do {
    fVar7 = (float)iVar1 * 0.041666668;
    fVar4 = 1.0 - fVar7;
    fVar5 = powf(fVar4,3.0);
    fVar6 = fVar4 * fVar4 * 3.0 * fVar7;
    fVar4 = fVar7 * fVar7 * fVar4 * 3.0;
    fVar7 = powf(fVar7,3.0);
    fVar9 = fVar7 * fStack_1f4 + fVar4 * fStack_204 + fVar5 * p1.y + fStack_214 * fVar6;
    local_218 = c2.x;
    local_208 = c3.x;
    local_1f8 = p4.x;
    fVar5 = fVar7 * local_1f8 + fVar4 * local_208 + fVar5 * local_228 + fVar6 * local_218;
    fVar6 = fVar9 - fVar3;
    fVar7 = fVar5 - fVar8;
    fVar4 = fVar7 * fVar7 + fVar6 * fVar6;
    if (fVar4 < 0.0) {
      fVar4 = sqrtf(fVar4);
    }
    else {
      fVar4 = SQRT(fVar4);
    }
    fVar4 = (thick * 0.5) / fVar4;
    fVar6 = fVar6 * fVar4;
    fVar7 = fVar7 * fVar4;
    if (lVar2 == 0x1c) {
      local_244 = fVar6 + fVar8;
      local_24c = fVar8 - fVar6;
      local_248 = fVar7 + fVar3;
      local_250 = fVar3 - fVar7;
    }
    *(float *)((long)afStack_1c4 + lVar2 + 8) = fVar5 - fVar6;
    *(float *)((long)&local_1b8.x + lVar2) = fVar7 + fVar9;
    *(float *)((long)afStack_1c4 + lVar2) = fVar6 + fVar5;
    *(float *)((long)afStack_1c4 + lVar2 + 4) = fVar9 - fVar7;
    lVar2 = lVar2 + 0x10;
    iVar1 = iVar1 + 1;
    fVar3 = fVar9;
    fVar8 = fVar5;
  } while (lVar2 != 0x19c);
  local_1b8.y = local_250;
  local_1b0 = local_24c;
  local_1ac = local_248;
  local_1b8.x = local_244;
  DrawTriangleStrip(&local_1b8,0x32,color);
  return;
}

Assistant:

void DrawSplineSegmentBezierCubic(Vector2 p1, Vector2 c2, Vector2 c3, Vector2 p4, float thick, Color color)
{
    const float step = 1.0f/SPLINE_SEGMENT_DIVISIONS;

    Vector2 previous = p1;
    Vector2 current = { 0 };
    float t = 0.0f;

    Vector2 points[2*SPLINE_SEGMENT_DIVISIONS + 2] = { 0 };

    for (int i = 1; i <= SPLINE_SEGMENT_DIVISIONS; i++)
    {
        t = step*(float)i;

        float a = powf(1.0f - t, 3);
        float b = 3.0f*powf(1.0f - t, 2)*t;
        float c = 3.0f*(1.0f - t)*powf(t, 2);
        float d = powf(t, 3);

        current.y = a*p1.y + b*c2.y + c*c3.y + d*p4.y;
        current.x = a*p1.x + b*c2.x + c*c3.x + d*p4.x;

        float dy = current.y - previous.y;
        float dx = current.x - previous.x;
        float size = 0.5f*thick/sqrtf(dx*dx+dy*dy);

        if (i == 1)
        {
            points[0].x = previous.x + dy*size;
            points[0].y = previous.y - dx*size;
            points[1].x = previous.x - dy*size;
            points[1].y = previous.y + dx*size;
        }

        points[2*i + 1].x = current.x - dy*size;
        points[2*i + 1].y = current.y + dx*size;
        points[2*i].x = current.x + dy*size;
        points[2*i].y = current.y - dx*size;

        previous = current;
    }

    DrawTriangleStrip(points, 2*SPLINE_SEGMENT_DIVISIONS + 2, color);
}